

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParallelDescriptor.H
# Opt level: O0

int amrex::ParallelDescriptor::MyProc(MPI_Comm comm)

{
  MPI_Comm comm_local;
  
  return 0;
}

Assistant:

inline int
    MyProc (MPI_Comm comm) noexcept
    {
#ifdef BL_USE_MPI
        int r;
        MPI_Comm_rank(comm,&r);
        return r;
#else
        amrex::ignore_unused(comm);
        return 0;
#endif
    }